

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.h
# Opt level: O0

executor * __thiscall
spdlog::logger::log_<int&>(logger *this,source_loc loc,level_enum lvl,string_view_t fmt,int *args)

{
  basic_format_args<fmt::v8::basic_format_context<fmt::v8::appender,_char>_> args_00;
  basic_string_view<char> fmt_00;
  char *s;
  size_t count;
  undefined8 in_RCX;
  int *args_01;
  log_msg *in_RSI;
  v8 *this_00;
  executor *in_RDI;
  undefined8 in_R8;
  format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_int> *in_R9;
  exception *ex;
  log_msg log_msg;
  memory_buf_t buf;
  bool traceback_enabled;
  bool log_enabled;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb98;
  undefined2 uVar1;
  basic_memory_buffer<char,_250UL,_std::allocator<char>_> *in_stack_fffffffffffffba0;
  basic_memory_buffer<char,_250UL,_std::allocator<char>_> *this_01;
  logger *in_stack_fffffffffffffba8;
  logger *this_02;
  undefined8 *puVar2;
  level_enum lvl_00;
  string_view_t in_stack_fffffffffffffc18;
  string_view_t in_stack_fffffffffffffc28;
  source_loc in_stack_fffffffffffffc40;
  basic_string_view<char> local_358;
  buffer<char> *in_stack_fffffffffffffcb8;
  locale_ref in_stack_fffffffffffffcc0;
  unsigned_long_long in_stack_fffffffffffffcc8;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v8::basic_format_context<fmt::v8::appender,_char>_>_2
  in_stack_fffffffffffffcd0;
  char *in_stack_fffffffffffffcd8;
  size_t in_stack_fffffffffffffce0;
  locale_ref local_2b0;
  format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_int> *local_2a8 [2];
  undefined8 local_298;
  format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_int> **local_290;
  undefined8 local_288;
  undefined8 uStack_280;
  v8 local_261;
  buffer<char> local_260 [9];
  undefined1 local_13a;
  byte local_139;
  format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_int> *local_138;
  undefined8 local_120;
  undefined8 uStack_118;
  format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_int> **local_108;
  undefined8 *local_100;
  format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_int> **local_70;
  format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_int> **local_68;
  undefined8 local_60;
  undefined8 *local_58;
  
  puVar2 = (undefined8 *)&stack0x00000008;
  local_138 = in_R9;
  local_120 = in_RCX;
  uStack_118 = in_R8;
  local_139 = should_log(in_stack_fffffffffffffba8,
                         (level_enum)((ulong)in_stack_fffffffffffffba0 >> 0x20));
  local_13a = details::backtracer::enabled((backtracer *)0x1405b0);
  if (((local_139 & 1) != 0) || ((bool)local_13a)) {
    this_00 = &local_261;
    std::allocator<char>::allocator();
    ::fmt::v8::basic_memory_buffer<char,_250UL,_std::allocator<char>_>::basic_memory_buffer
              (in_stack_fffffffffffffba0,(allocator<char> *)in_stack_fffffffffffffb98);
    std::allocator<char>::~allocator((allocator<char> *)&local_261);
    local_288 = local_120;
    uStack_280 = uStack_118;
    local_2a8[0] = ::fmt::v8::
                   make_format_args<fmt::v8::basic_format_context<fmt::v8::appender,char>,int>
                             (local_138,this_00,args_01);
    local_100 = &local_298;
    local_108 = local_2a8;
    local_60 = 1;
    local_298 = 1;
    local_70 = local_108;
    local_68 = local_108;
    local_58 = local_100;
    local_290 = local_108;
    ::fmt::v8::detail::locale_ref::locale_ref(&local_2b0);
    fmt_00.size_ = in_stack_fffffffffffffce0;
    fmt_00.data_ = in_stack_fffffffffffffcd8;
    args_00.field_1.values_ = in_stack_fffffffffffffcd0.values_;
    args_00.desc_ = in_stack_fffffffffffffcc8;
    ::fmt::v8::detail::vformat_to<char>
              (in_stack_fffffffffffffcb8,fmt_00,args_00,in_stack_fffffffffffffcc0);
    this_02 = (logger *)puVar2[2];
    uVar1 = (undefined2)((ulong)*puVar2 >> 0x30);
    this_01 = (basic_memory_buffer<char,_250UL,_std::allocator<char>_> *)puVar2[1];
    ::fmt::v8::basic_string_view<char>::
    basic_string_view<std::char_traits<char>,std::allocator<char>>
              ((basic_string_view<char> *)in_stack_fffffffffffffba0,in_stack_fffffffffffffb98);
    lvl_00 = (level_enum)((ulong)puVar2 >> 0x20);
    s = ::fmt::v8::detail::buffer<char>::data(local_260);
    count = ::fmt::v8::detail::buffer<char>::size(local_260);
    ::fmt::v8::basic_string_view<char>::basic_string_view(&local_358,s,count);
    details::log_msg::log_msg
              (in_RSI,in_stack_fffffffffffffc40,in_stack_fffffffffffffc28,lvl_00,
               in_stack_fffffffffffffc18);
    log_it_(this_02,(log_msg *)this_01,SUB21((ushort)uVar1 >> 8,0),SUB21(uVar1,0));
    ::fmt::v8::basic_memory_buffer<char,_250UL,_std::allocator<char>_>::~basic_memory_buffer
              (this_01);
  }
  else {
    details::executor::executor(in_RDI);
  }
  return in_RDI;
}

Assistant:

SPDLOG_EXECUTOR_T log_(source_loc loc, level::level_enum lvl, string_view_t fmt, Args &&...args)
    {
        bool log_enabled = should_log(lvl);
        bool traceback_enabled = tracer_.enabled();
        if (!log_enabled && !traceback_enabled)
        {
            return SPDLOG_EXECUTOR_T{};
        }
        SPDLOG_TRY
        {
            memory_buf_t buf;
            fmt::detail::vformat_to(buf, fmt, fmt::make_format_args(args...));
            details::log_msg log_msg(loc, name_, lvl, string_view_t(buf.data(), buf.size()));
            return log_it_(log_msg, log_enabled, traceback_enabled);
        }